

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psi.cpp
# Opt level: O0

void __thiscall
pg::PSISolver::compute_val(PSISolver *this,WorkerP *__lace_worker,Task *__lace_dq_head,int v)

{
  int iVar1;
  void *__dest;
  int local_38;
  int next;
  int from;
  int count;
  int *dst;
  int st;
  int v_local;
  Task *__lace_dq_head_local;
  WorkerP *__lace_worker_local;
  PSISolver *this_local;
  
  *(undefined4 *)(done + (long)v * 4) = 1;
  iVar1 = *(int *)(str + (long)v * 4);
  __dest = (void *)(val + (long)(int)(pg::k * v) * 4);
  if ((iVar1 == -1) || (*(int *)(halt + (long)iVar1 * 4) != 0)) {
    memset(__dest,0,(ulong)pg::k << 2);
  }
  else {
    memcpy(__dest,(void *)(val + (long)(int)(pg::k * iVar1) * 4),(ulong)pg::k << 2);
  }
  iVar1 = Solver::priority(&this->super_Solver,v);
  *(int *)((long)__dest + (long)iVar1 * 4) = *(int *)((long)__dest + (long)iVar1 * 4) + 1;
  next = 0;
  local_38 = *(int *)(first_in + (long)v * 4);
  _st = __lace_dq_head;
  do {
    if (local_38 == -1) {
LAB_001eaee6:
      while (next != 0) {
        _st = _st + -1;
        compute_val_SYNC(__lace_worker,_st);
        next = next + -1;
      }
      return;
    }
    iVar1 = *(int *)(next_in + (long)local_38 * 4);
    if (iVar1 == -1) {
      compute_val_CALL(__lace_worker,_st,local_38,this);
      goto LAB_001eaee6;
    }
    compute_val_SPAWN(__lace_worker,_st,local_38,this);
    _st = _st + 1;
    next = next + 1;
    local_38 = iVar1;
  } while( true );
}

Assistant:

void
PSISolver::compute_val(WorkerP* __lace_worker, Task* __lace_dq_head, int v)
{
    // mark node as visited
    done[v] = 1;

    // compute valuation of current node
    int st = str[v];
    int *dst = val + k*v;
    if (st == -1 or halt[st]) memset(dst, 0, sizeof(int[k]));
    else memcpy(dst, val + k*st, sizeof(int[k])); // copy from successor
    dst[priority(v)]++;

    // recursively update predecessor positions
    int count = 0;
    int from = first_in[v];
    while (from != -1) {
        int next = next_in[from];
        if (next != -1) {
            SPAWN(compute_val, from, this);
            count++;
        } else {
            CALL(compute_val, from, this);
            break;
        }
        from = next;
    }

    while (count--) {
        SYNC(compute_val);
    }
}